

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdaref_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::LambdaRefExpression::FindMatchingBinding
          (LambdaRefExpression *this,
          optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *lambda_bindings,
          string *column_name)

{
  vector<duckdb::DummyBinding,_true> *pvVar1;
  reference this_00;
  bool bVar2;
  size_type local_30;
  _func_int **local_28;
  
  if (lambda_bindings->ptr == (vector<duckdb::DummyBinding,_true> *)0x0) {
LAB_0166011f:
    (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = (_func_int **)0x0;
  }
  else {
    pvVar1 = optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator->
                       (lambda_bindings);
    local_30 = ((long)(pvVar1->
                      super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                      super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar1->
                     super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                     super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x108;
    do {
      bVar2 = local_30 == 0;
      local_30 = local_30 - 1;
      if (bVar2) goto LAB_0166011f;
      pvVar1 = optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator*
                         (lambda_bindings);
      this_00 = vector<duckdb::DummyBinding,_true>::get<true>(pvVar1,local_30);
      bVar2 = Binding::HasMatchingBinding(&this_00->super_Binding,column_name);
    } while (!bVar2);
    make_uniq<duckdb::LambdaRefExpression,unsigned_long,std::__cxx11::string_const&>
              ((duckdb *)&local_28,&local_30,column_name);
    (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = local_28;
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression>
LambdaRefExpression::FindMatchingBinding(optional_ptr<vector<DummyBinding>> &lambda_bindings,
                                         const string &column_name) {

	// if this is a lambda parameter, then we temporarily add a BoundLambdaRef,
	// which we capture and remove later

	// inner lambda parameters have precedence over outer lambda parameters, and
	// lambda parameters have precedence over macros and columns

	if (lambda_bindings) {
		for (idx_t i = lambda_bindings->size(); i > 0; i--) {
			if ((*lambda_bindings)[i - 1].HasMatchingBinding(column_name)) {
				D_ASSERT((*lambda_bindings)[i - 1].alias.IsSet());
				return make_uniq<LambdaRefExpression>(i - 1, column_name);
			}
		}
	}

	return nullptr;
}